

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O0

lzham_decompress_status_t
lzham::lzham_lib_decompress_memory
          (lzham_decompress_params *pParams,lzham_uint8 *pDst_buf,size_t *pDst_len,
          lzham_uint8 *pSrc_buf,size_t src_len,lzham_uint32 *pAdler32)

{
  uint32 uVar1;
  lzham_decompress_state_ptr pvVar2;
  lzham_decompress_state_ptr in_RCX;
  undefined8 *in_RDI;
  lzham_uint8 *in_R8;
  size_t *in_R9;
  uint32 adler32;
  lzham_decompress_status_t status;
  lzham_decompress_state_ptr pState;
  lzham_decompress_params params;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  size_t *pOut_buf_size;
  lzham_uint8 *pOut_buf;
  lzham_decompress_status_t local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
  }
  else {
    pOut_buf_size = (size_t *)*in_RDI;
    pOut_buf = (lzham_uint8 *)CONCAT44((int)((ulong)in_RDI[1] >> 0x20),1);
    pvVar2 = lzham_lib_decompress_init
                       ((lzham_decompress_params *)
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (pvVar2 == (lzham_decompress_state_ptr)0x0) {
      local_4 = LZHAM_DECOMP_STATUS_FAILED;
    }
    else {
      local_4 = lzham_lib_decompress
                          (in_RCX,in_R8,in_R9,pOut_buf,pOut_buf_size,
                           (lzham_bool)((ulong)pvVar2 >> 0x20));
      uVar1 = lzham_lib_decompress_deinit(pOut_buf_size);
      if (in_R9 != (size_t *)0x0) {
        *(uint32 *)in_R9 = uVar1;
      }
    }
  }
  return local_4;
}

Assistant:

lzham_decompress_status_t lzham_lib_decompress_memory(const lzham_decompress_params *pParams, lzham_uint8* pDst_buf, size_t *pDst_len, const lzham_uint8* pSrc_buf, size_t src_len, lzham_uint32 *pAdler32)
   {
      if (!pParams)
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;

      lzham_decompress_params params(*pParams);
      params.m_output_unbuffered = true;

      lzham_decompress_state_ptr pState = lzham_lib_decompress_init(&params);
      if (!pState)
         return LZHAM_DECOMP_STATUS_FAILED;

      lzham_decompress_status_t status = lzham_lib_decompress(pState, pSrc_buf, &src_len, pDst_buf, pDst_len, true);

      uint32 adler32 = lzham_lib_decompress_deinit(pState);
      if (pAdler32)
         *pAdler32 = adler32;

      return status;
   }